

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O1

void __thiscall
TPZFileEqnStorage<long_double>::AddEqnArray
          (TPZFileEqnStorage<long_double> *this,TPZEqnArray<long_double> *EqnArray)

{
  int iVar1;
  long lVar2;
  int64_t nextaddress;
  long local_18;
  
  iVar1 = this->fCurrentBlock;
  if (iVar1 % (this->fNumHeaders + -1) == 0) {
    WriteHeaders(this);
  }
  else if (iVar1 != 0) {
    TPZStack<long,_10>::Push
              (&this->fBlockPos,
               (this->fBlockPos).super_TPZManVector<long,_10>.super_TPZVec<long>.fStore
               [(long)iVar1 + -1] + 8);
  }
  TPZEqnArray<long_double>::Write(EqnArray,this->fIOStream);
  local_18 = ftell((FILE *)this->fIOStream);
  fseek((FILE *)this->fIOStream,
        (this->fBlockPos).super_TPZManVector<long,_10>.super_TPZVec<long>.fStore
        [this->fCurrentBlock] + 8,0);
  lVar2 = ftell((FILE *)this->fIOStream);
  this->fCurBlockPosition = (int)lVar2;
  fwrite(&local_18,8,1,(FILE *)this->fIOStream);
  fseek((FILE *)this->fIOStream,local_18,0);
  this->fCurrentBlock = this->fCurrentBlock + 1;
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::AddEqnArray(TPZEqnArray<TVar> *EqnArray)
{
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "fCurrentBlock "<< fCurrentBlock << " fNumHeaders " << fNumHeaders;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
  	
	if(fCurrentBlock%(fNumHeaders-1)==0) {
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            LOGPZ_DEBUG(logger,"writing headers")
        }
#endif
		WriteHeaders();
		//		fBlockPos.Push(fBlockPos[fCurrentBlock-1]+sizeof(int64_t));
		
	}else if(fCurrentBlock!=0){
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
            std::stringstream sout;
            sout << "fCurrentBlock " << fCurrentBlock << " fBlockPos[fCurrentBlock-1] "<< fBlockPos[fCurrentBlock-1] << fBlockPos;
            LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		fBlockPos.Push(fBlockPos[fCurrentBlock-1]+sizeof(int64_t));
	}
	
	EqnArray->Write(fIOStream); 
	
	/**Gets actual position on fIOStream */
	int64_t nextaddress=ftell(fIOStream);

	/** 
	 *Writes this address on next available header block
	 *and sets pointer to its previous position
	 */
	//fseek(fIOStream,fCurBlockPosition+sizeof(int64_t),SEEK_SET);
	fseek(fIOStream,fBlockPos[fCurrentBlock]+sizeof(int64_t),SEEK_SET);
  	fCurBlockPosition=ftell(fIOStream);
  	fwrite(&nextaddress,sizeof(int64_t),1,fIOStream);
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "nextaddress " << nextaddress << " fCurBlockPosition " << fCurBlockPosition;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
	fseek(fIOStream,nextaddress,SEEK_SET);
	
	fCurrentBlock++;
}